

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::cmLocalUnixMakefileGenerator3
          (cmLocalUnixMakefileGenerator3 *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  char *pcVar1;
  allocator local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmGlobalGenerator *gg_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)gg;
  gg_local = (cmGlobalGenerator *)this;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(mf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  cmLocalCommonGenerator::cmLocalCommonGenerator
            (&this->super_cmLocalCommonGenerator,gg,mf,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalUnixMakefileGenerator3_00befc40;
  ImplicitDependTargetMap::ImplicitDependTargetMap(&this->ImplicitDepends);
  std::__cxx11::string::string((string *)&this->HomeRelativeOutputPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LocalHelp);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->MakeVariableMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ShortMakeVariableMap);
  this->MakefileVariableSize = 0;
  this->ColorMakefile = false;
  this->SkipPreprocessedSourceRules = false;
  this->SkipAssemblySourceRules = false;
  this->MakeCommandEscapeTargetTwice = false;
  this->BorlandMakeCurlyHack = false;
  return;
}

Assistant:

cmLocalUnixMakefileGenerator3::cmLocalUnixMakefileGenerator3(
  cmGlobalGenerator* gg, cmMakefile* mf)
  : cmLocalCommonGenerator(gg, mf, mf->GetCurrentBinaryDirectory())
{
  this->MakefileVariableSize = 0;
  this->ColorMakefile = false;
  this->SkipPreprocessedSourceRules = false;
  this->SkipAssemblySourceRules = false;
  this->MakeCommandEscapeTargetTwice = false;
  this->BorlandMakeCurlyHack = false;
}